

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint in_ESI;
  long in_RDI;
  byte bVar3;
  float fVar4;
  float fVar5;
  ImRect *unaff_retaddr;
  float r_surface;
  ImRect r;
  bool was_accepted_previously;
  ImGuiPayload *payload;
  ImGuiContext *g;
  byte local_46;
  bool local_45;
  float button;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  ImRect *in_stack_fffffffffffffff8;
  ImGuiPayload *pIVar6;
  
  pIVar1 = GImGui;
  pIVar6 = &GImGui->DragDropPayload;
  if ((in_RDI == 0) ||
     (bVar2 = ImGuiPayload::IsDataType
                        ((ImGuiPayload *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
     bVar2)) {
    bVar3 = pIVar1->DragDropAcceptIdPrev == pIVar1->DragDropTargetId;
    button = (pIVar1->DragDropTargetRect).Min.x;
    fVar4 = ImRect::GetWidth((ImRect *)&stack0xffffffffffffffc4);
    fVar5 = ImRect::GetHeight((ImRect *)&stack0xffffffffffffffc4);
    fVar4 = fVar4 * fVar5;
    if (fVar4 < pIVar1->DragDropAcceptIdCurrRectSurface ||
        fVar4 == pIVar1->DragDropAcceptIdCurrRectSurface) {
      pIVar1->DragDropAcceptFlags = in_ESI;
      pIVar1->DragDropAcceptIdCurr = pIVar1->DragDropTargetId;
      pIVar1->DragDropAcceptIdCurrRectSurface = fVar4;
      (pIVar1->DragDropPayload).Preview = (bool)(bVar3 & 1);
      if (((pIVar1->DragDropSourceFlags & 0x800U) == 0 && (in_ESI & 0x800) == 0) &&
         (((pIVar1->DragDropPayload).Preview & 1U) != 0)) {
        RenderDragDropTargetRect(unaff_retaddr,in_stack_fffffffffffffff8);
      }
      pIVar1->DragDropAcceptFrameCount = pIVar1->FrameCount;
      if (((pIVar1->DragDropSourceFlags & 0x10U) == 0) || (pIVar1->DragDropMouseButton != -1)) {
        local_46 = 0;
        if ((bVar3 & 1) != 0) {
          bVar2 = IsMouseDown((ImGuiMouseButton)button);
          local_46 = bVar2 ^ 0xff;
        }
        (pIVar1->DragDropPayload).Delivery = (bool)(local_46 & 1);
      }
      else {
        local_45 = false;
        if ((bVar3 & 1) != 0) {
          local_45 = pIVar1->DragDropSourceFrameCount < pIVar1->FrameCount;
        }
        (pIVar1->DragDropPayload).Delivery = local_45;
      }
      if ((((pIVar1->DragDropPayload).Delivery & 1U) == 0) && ((in_ESI & 0x400) == 0)) {
        pIVar6 = (ImGuiPayload *)0x0;
      }
      else if ((((pIVar1->DragDropPayload).Delivery & 1U) != 0) &&
              ((pIVar1->DebugLogFlags & 1U) != 0)) {
        DebugLog("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n",
                 (ulong)pIVar1->DragDropTargetId);
      }
    }
    else {
      pIVar6 = (ImGuiPayload *)0x0;
    }
  }
  else {
    pIVar6 = (ImGuiPayload *)0x0;
  }
  return pIVar6;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface > g.DragDropAcceptIdCurrRectSurface)
        return NULL;

    g.DragDropAcceptFlags = flags;
    g.DragDropAcceptIdCurr = g.DragDropTargetId;
    g.DragDropAcceptIdCurrRectSurface = r_surface;
    //IMGUI_DEBUG_LOG("AcceptDragDropPayload(): %08X: accept\n", g.DragDropTargetId);

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that live for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        RenderDragDropTargetRect(r, g.DragDropTargetClipRect);

    g.DragDropAcceptFrameCount = g.FrameCount;
    if ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) && g.DragDropMouseButton == -1)
        payload.Delivery = was_accepted_previously && (g.DragDropSourceFrameCount < g.FrameCount);
    else
        payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting OS window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    if (payload.Delivery)
        IMGUI_DEBUG_LOG_ACTIVEID("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n", g.DragDropTargetId);
    return &payload;
}